

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>,_bool>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
InnerMap::insert(pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>,_bool>
                 *__return_storage_ptr__,InnerMap *this,KeyValuePair *kv)

{
  Arena *this_00;
  pointer pcVar1;
  unsigned_long b;
  bool bVar2;
  Node *node;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>,_unsigned_long>
  p;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>,_unsigned_long>
  local_68;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>,_unsigned_long>
  local_48;
  
  FindHelper(&local_68,this,&kv->k_,(TreeIterator *)0x0);
  if (local_68.first.node_ == (Node *)0x0) {
    bVar2 = ResizeIfLoadIsOutOfRange(this,this->num_elements_ + 1);
    if (bVar2) {
      FindHelper(&local_48,this,&kv->k_,(TreeIterator *)0x0);
      local_68.first.node_ = local_48.first.node_;
      local_68.first.m_ = local_48.first.m_;
      local_68.first.bucket_index_ = local_48.first.bucket_index_;
      local_68.second = local_48.second;
    }
    b = local_68.second;
    this_00 = (this->alloc_).arena_;
    if (this_00 == (Arena *)0x0) {
      node = (Node *)operator_new(0x30);
    }
    else {
      node = (Node *)Arena::AllocateAligned(this_00,(type_info *)&unsigned_char::typeinfo,0x30);
    }
    (node->kv).k_._M_dataplus._M_p = (pointer)&(node->kv).k_.field_2;
    pcVar1 = (kv->k_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)node,pcVar1,pcVar1 + (kv->k_)._M_string_length);
    (node->kv).v_ = kv->v_;
    InsertUnique(&__return_storage_ptr__->first,this,b,node);
    this->num_elements_ = this->num_elements_ + 1;
    bVar2 = true;
  }
  else {
    (__return_storage_ptr__->first).node_ = local_68.first.node_;
    (__return_storage_ptr__->first).m_ = local_68.first.m_;
    (__return_storage_ptr__->first).bucket_index_ = local_68.first.bucket_index_;
    bVar2 = false;
  }
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const KeyValuePair& kv) {
      std::pair<const_iterator, size_type> p = FindHelper(kv.key());
      // Case 1: key was already present.
      if (p.first.node_ != NULL)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(kv.key());
      }
      const size_type b = p.second;  // bucket number
      Node* node = Alloc<Node>(1);
      alloc_.construct(&node->kv, kv);
      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }